

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O0

void __thiscall Assimp::BVHLoader::ReadMotion(BVHLoader *this,aiScene *param_1)

{
  bool bVar1;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar2;
  basic_formatter *pbVar3;
  pointer pNVar4;
  ulong uVar5;
  pointer pNVar6;
  size_type sVar7;
  float fVar8;
  float local_3f0;
  uint local_3ec;
  iterator iStack_3e8;
  uint c;
  __normal_iterator<Assimp::BVHLoader::Node_*,_std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>_>
  local_3e0;
  iterator it_1;
  iterator iStack_3d0;
  uint frame;
  __normal_iterator<Assimp::BVHLoader::Node_*,_std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>_>
  local_3c8;
  iterator it;
  string local_248;
  undefined1 local_228 [8];
  string tokenDuration2;
  string tokenDuration1;
  undefined1 local_1e0 [4];
  float numFramesFloat;
  string local_68;
  undefined1 local_38 [8];
  string tokenFrames;
  aiScene *param_1_local;
  BVHLoader *this_local;
  
  tokenFrames.field_2._8_8_ = param_1;
  GetNextToken_abi_cxx11_((string *)local_38,this);
  bVar1 = std::operator!=((string *)local_38,"Frames:");
  if (bVar1) {
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0);
    pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        local_1e0,(char (*) [44])"Expected frame count \"Frames:\", but found \"");
    pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_38);
    pbVar3 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar2,(char (*) [3])0xbb58f8);
    Formatter::basic_formatter::operator_cast_to_string(&local_68,pbVar3);
    ThrowException(this,&local_68);
  }
  fVar8 = GetNextTokenAsFloat(this);
  this->mAnimNumFrames = (uint)(long)fVar8;
  GetNextToken_abi_cxx11_((string *)((long)&tokenDuration2.field_2 + 8),this);
  GetNextToken_abi_cxx11_((string *)local_228,this);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&tokenDuration2.field_2 + 8),"Frame");
  if (!bVar1) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_228,"Time:");
    if (!bVar1) {
      fVar8 = GetNextTokenAsFloat(this);
      this->mAnimTickDuration = fVar8;
      local_3c8._M_current =
           (Node *)std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>::
                   begin(&this->mNodes);
      while( true ) {
        iStack_3d0 = std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                     ::end(&this->mNodes);
        bVar1 = __gnu_cxx::operator!=(&local_3c8,&stack0xfffffffffffffc30);
        if (!bVar1) break;
        pNVar6 = __gnu_cxx::
                 __normal_iterator<Assimp::BVHLoader::Node_*,_std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>_>
                 ::operator->(&local_3c8);
        pNVar4 = __gnu_cxx::
                 __normal_iterator<Assimp::BVHLoader::Node_*,_std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>_>
                 ::operator->(&local_3c8);
        sVar7 = std::
                vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                ::size(&pNVar4->mChannels);
        std::vector<float,_std::allocator<float>_>::reserve
                  (&pNVar6->mChannelValues,sVar7 * this->mAnimNumFrames);
        __gnu_cxx::
        __normal_iterator<Assimp::BVHLoader::Node_*,_std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>_>
        ::operator++(&local_3c8);
      }
      for (it_1._M_current._4_4_ = 0; it_1._M_current._4_4_ < this->mAnimNumFrames;
          it_1._M_current._4_4_ = it_1._M_current._4_4_ + 1) {
        local_3e0._M_current =
             (Node *)std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>
                     ::begin(&this->mNodes);
        while( true ) {
          iStack_3e8 = std::
                       vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>::
                       end(&this->mNodes);
          bVar1 = __gnu_cxx::operator!=(&local_3e0,&stack0xfffffffffffffc18);
          if (!bVar1) break;
          local_3ec = 0;
          while( true ) {
            uVar5 = (ulong)local_3ec;
            pNVar6 = __gnu_cxx::
                     __normal_iterator<Assimp::BVHLoader::Node_*,_std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>_>
                     ::operator->(&local_3e0);
            sVar7 = std::
                    vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
                    ::size(&pNVar6->mChannels);
            if (sVar7 <= uVar5) break;
            pNVar6 = __gnu_cxx::
                     __normal_iterator<Assimp::BVHLoader::Node_*,_std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>_>
                     ::operator->(&local_3e0);
            local_3f0 = GetNextTokenAsFloat(this);
            std::vector<float,_std::allocator<float>_>::push_back
                      (&pNVar6->mChannelValues,&local_3f0);
            local_3ec = local_3ec + 1;
          }
          __gnu_cxx::
          __normal_iterator<Assimp::BVHLoader::Node_*,_std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>_>
          ::operator++(&local_3e0);
        }
      }
      std::__cxx11::string::~string((string *)local_228);
      std::__cxx11::string::~string((string *)(tokenDuration2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_38);
      return;
    }
  }
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&it,
                      (char (*) [51])"Expected frame duration \"Frame Time:\", but found \"");
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&tokenDuration2.field_2 + 8));
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar2,(char (*) [2])0xbc1270);
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_228);
  pbVar3 = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar2,(char (*) [3])0xbb58f8);
  Formatter::basic_formatter::operator_cast_to_string(&local_248,pbVar3);
  ThrowException(this,&local_248);
}

Assistant:

void BVHLoader::ReadMotion( aiScene* /*pScene*/)
{
    // Read number of frames
    std::string tokenFrames = GetNextToken();
    if( tokenFrames != "Frames:")
        ThrowException( format() << "Expected frame count \"Frames:\", but found \"" << tokenFrames << "\".");

    float numFramesFloat = GetNextTokenAsFloat();
    mAnimNumFrames = (unsigned int) numFramesFloat;

    // Read frame duration
    std::string tokenDuration1 = GetNextToken();
    std::string tokenDuration2 = GetNextToken();
    if( tokenDuration1 != "Frame" || tokenDuration2 != "Time:")
        ThrowException( format() << "Expected frame duration \"Frame Time:\", but found \"" << tokenDuration1 << " " << tokenDuration2 << "\"." );

    mAnimTickDuration = GetNextTokenAsFloat();

    // resize value vectors for each node
    for( std::vector<Node>::iterator it = mNodes.begin(); it != mNodes.end(); ++it)
        it->mChannelValues.reserve( it->mChannels.size() * mAnimNumFrames);

    // now read all the data and store it in the corresponding node's value vector
    for( unsigned int frame = 0; frame < mAnimNumFrames; ++frame)
    {
        // on each line read the values for all nodes
        for( std::vector<Node>::iterator it = mNodes.begin(); it != mNodes.end(); ++it)
        {
            // get as many values as the node has channels
            for( unsigned int c = 0; c < it->mChannels.size(); ++c)
                it->mChannelValues.push_back( GetNextTokenAsFloat());
        }

        // after one frame worth of values for all nodes there should be a newline, but we better don't rely on it
    }
}